

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::TextureLevel::TextureLevel
          (TextureLevel *this,TextureFormat *format,int width,int height,int depth)

{
  this->m_format = *format;
  Vector<int,_3>::Vector(&this->m_size,0);
  (this->m_data).m_ptr = (void *)0x0;
  (this->m_data).m_cap = 0;
  setSize(this,width,height,depth);
  return;
}

Assistant:

TextureLevel::TextureLevel (const TextureFormat& format, int width, int height, int depth)
	: m_format	(format)
	, m_size	(0)
{
	setSize(width, height, depth);
}